

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void * __thiscall mymalloc::Heap::malloc(Heap *this,size_t __size)

{
  bool bVar1;
  Cache *this_00;
  mapped_type *ppCVar2;
  int size;
  _Self local_40;
  _Self local_38;
  key_type local_30;
  id id;
  Cache *cache;
  int size_local;
  Heap *this_local;
  
  size = (int)__size;
  if (size < 1) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JameyWoo[P]mymalloc/heap.cpp"
                  ,0x12,"void *mymalloc::Heap::malloc(int)");
  }
  if (size < 0x8001) {
    local_30._M_thread = (native_handle_type)std::this_thread::get_id();
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
         ::find(&this->cacheMap,&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
         ::end(&this->cacheMap);
    bVar1 = std::operator==(&local_38,&local_40);
    if (bVar1) {
      this_00 = (Cache *)operator_new(0xed8);
      Cache::Cache(this_00,(Central *)&this->field_0x60,&this->spanMap);
      id._M_thread = (native_handle_type)this_00;
      ppCVar2 = std::
                map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
                ::operator[](&this->cacheMap,&local_30);
      *ppCVar2 = this_00;
    }
    ppCVar2 = std::
              map<std::thread::id,_Cache_*,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_Cache_*>_>_>
              ::operator[](&this->cacheMap,&local_30);
    id._M_thread = (native_handle_type)*ppCVar2;
    this_local = (Heap *)Cache::malloc((Cache *)id._M_thread,__size & 0xffffffff);
  }
  else {
    this_local = (Heap *)bigObjectMalloc(this,size);
  }
  return this_local;
}

Assistant:

void *mymalloc::Heap::malloc(int size) {
    assert(size > 0);  // 要分配内存必须size > 0
    if (size > maxSmallObjectSize) {  // 大对象分配
        return bigObjectMalloc(size);
    }

    Cache* cache;
    auto id = std::this_thread::get_id();
    // 选择对应的 Cache结构来进行内存分配
    if (this->cacheMap.find(id) == this->cacheMap.end()) {
        // 如果没有当前线程id的缓存结构, 那么创建一个
        cache = new Cache(this->ctls, &this->spanMap);
        this->cacheMap[id] = cache;  // 把 central 数组的地址传进去
    }
    cache = this->cacheMap[id];
    return cache->malloc(size);
}